

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdr.cpp
# Opt level: O0

void __thiscall neueda::cdr::setArray(cdr *this,cdrKey_t *key,cdrArray *value)

{
  size_type sVar1;
  mapped_type *pmVar2;
  key_type_conflict *in_RDI;
  key_type_conflict *in_stack_00000008;
  map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
  *in_stack_00000010;
  cdrItem *item;
  vector<neueda::cdr,_std::allocator<neueda::cdr>_> *in_stack_00000068;
  cdr *in_stack_00000070;
  map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
  *in_stack_ffffffffffffffe0;
  
  sVar1 = std::
          map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
          ::count(in_stack_ffffffffffffffe0,in_RDI);
  if (sVar1 != 0) {
    pmVar2 = std::
             map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
             ::operator[](in_stack_00000010,in_stack_00000008);
    if (pmVar2->mType == CDR_ARRAY) goto LAB_0011491e;
  }
  emptyArray(in_stack_00000070,(cdrKey_t *)in_stack_00000068);
LAB_0011491e:
  pmVar2 = std::
           map<int,_neueda::cdrItem,_std::less<int>,_std::allocator<std::pair<const_int,_neueda::cdrItem>_>_>
           ::operator[](in_stack_00000010,in_stack_00000008);
  if (pmVar2->mType == CDR_STRING) {
    std::__cxx11::string::clear();
  }
  std::vector<neueda::cdr,_std::allocator<neueda::cdr>_>::operator=
            ((vector<neueda::cdr,_std::allocator<neueda::cdr>_> *)in_stack_00000070,
             in_stack_00000068);
  return;
}

Assistant:

void
cdr::setArray (const cdrKey_t& key, cdrArray value)
{
    if (mItems.count (key) == 0 || mItems[key].mType != CDR_ARRAY)
        emptyArray (key);
    cdrItem* item = &mItems[key];
    if (item->mType == CDR_STRING)
        item->mString.clear ();
    item->mArray = value;
}